

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  ushort *puVar4;
  ushort uVar5;
  long lVar6;
  char *pcVar7;
  char *pB1;
  ushort uVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  ushort *local_78;
  ushort local_58;
  ushort local_50;
  ushort local_48;
  
  pcVar9 = zSrc + nLen;
  for (pcVar11 = zSrc; pcVar11 < pcVar9; pcVar11 = pcVar11 + 1) {
    ppuVar3 = __ctype_b_loc();
    cVar1 = *pcVar11;
    if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if ((cVar1 == '+') || (cVar1 == '-')) {
        bVar12 = cVar1 == '-';
        pcVar11 = pcVar11 + 1;
        goto LAB_00119d71;
      }
      break;
    }
  }
  bVar12 = false;
LAB_00119d71:
  for (lVar6 = 0; (pB1 = pcVar11 + lVar6, pB1 < pcVar9 && (*pB1 == '0')); lVar6 = lVar6 + 1) {
  }
  uVar5 = 0x13;
  if (0x12 < ((nLen + (int)zSrc) - (int)pcVar11) - (int)lVar6) {
    pcVar7 = "9223372036854775808";
    if (!bVar12) {
      pcVar7 = "9223372036854775807";
    }
    sVar2 = SyMemcmp(pB1,pcVar7,0x13);
    uVar5 = sVar2 < 1 | 0x12;
  }
  local_58 = uVar5 - 3;
  local_50 = uVar5 - 2;
  local_48 = uVar5 - 1;
  lVar10 = 0;
  local_78 = (ushort *)0x0;
  while( true ) {
    puVar4 = local_78;
    pcVar7 = pB1;
    if ((pcVar9 <= pcVar11 + lVar10 + lVar6) || (uVar8 = (ushort)lVar10, uVar5 == uVar8))
    goto LAB_00119f40;
    ppuVar3 = __ctype_b_loc();
    puVar4 = *ppuVar3;
    pcVar7 = pcVar11 + lVar10 + lVar6;
    if ((*(byte *)((long)puVar4 + (long)pcVar11[lVar6 + lVar10] * 2 + 1) & 8) == 0)
    goto LAB_00119f40;
    local_78 = (ushort *)((long)local_78 * 10 + (long)pcVar11[lVar6 + lVar10] + -0x30);
    if ((pcVar9 <= pcVar11 + lVar10 + lVar6 + 1) || (local_48 == uVar8)) break;
    if ((*(byte *)((long)puVar4 + (long)pcVar11[lVar6 + lVar10 + 1] * 2 + 1) & 8) == 0) {
      pcVar7 = pB1 + 1;
      goto LAB_00119f40;
    }
    local_78 = (ushort *)((long)local_78 * 10 + (long)pcVar11[lVar6 + lVar10 + 1] + -0x30);
    if ((pcVar9 <= pcVar11 + lVar10 + lVar6 + 2) || (local_50 == uVar8)) {
      pcVar7 = pcVar11 + lVar10 + lVar6 + 2;
      goto LAB_00119f40;
    }
    if ((*(byte *)((long)puVar4 + (long)pcVar11[lVar6 + lVar10 + 2] * 2 + 1) & 8) == 0) {
      pcVar7 = pB1 + 2;
      goto LAB_00119f40;
    }
    local_78 = (ushort *)((long)local_78 * 10 + (long)pcVar11[lVar6 + lVar10 + 2] + -0x30);
    pcVar7 = pB1 + 3;
    if ((pcVar9 <= pcVar11 + lVar10 + lVar6 + 3) || (local_58 == uVar8)) goto LAB_00119f40;
    if ((*(byte *)((long)puVar4 + (long)pcVar11[lVar6 + lVar10 + 3] * 2 + 1) & 8) == 0) {
      pcVar7 = pcVar11 + lVar10 + lVar6 + 3;
      goto LAB_00119f40;
    }
    local_78 = (ushort *)((long)local_78 * 10 + (long)pcVar11[lVar6 + lVar10 + 3] + -0x30);
    pB1 = pB1 + 4;
    lVar10 = lVar10 + 4;
  }
  pcVar7 = pcVar11 + lVar10 + lVar6 + 1;
LAB_00119f40:
  do {
    if (pcVar9 <= pcVar7) break;
    ppuVar3 = __ctype_b_loc();
    puVar4 = *ppuVar3;
    cVar1 = *pcVar7;
    pcVar7 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  if (pOutVal != (void *)0x0) {
    puVar4 = (ushort *)-(long)local_78;
    if (local_78 == (ushort *)0x0) {
      puVar4 = local_78;
    }
    if (!bVar12) {
      puVar4 = local_78;
    }
    *(ushort **)pOutVal = puVar4;
  }
  return (sxi32)puVar4;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi64 nVal;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	i = 19;
	if( (sxu32)(zEnd-zSrc) >= 19 ){
		i = SyMemcmp(zSrc, isNeg ? SXINT64_MIN_STR : SXINT64_MAX_STR, 19) <= 0 ? 19 : 18 ;
	}
	nVal = 0;
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}